

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpke_test.cc
# Opt level: O0

bool bssl::anon_unknown_12::FileTestReadInt<unsigned_short>
               (FileTest *file_test,unsigned_short *out,string *key)

{
  bool bVar1;
  bool local_59;
  undefined1 local_40 [8];
  string s;
  string *key_local;
  unsigned_short *out_local;
  FileTest *file_test_local;
  
  s.field_2._8_8_ = key;
  std::__cxx11::string::string((string *)local_40);
  bVar1 = FileTest::GetAttribute(file_test,(string *)local_40,(string *)s.field_2._8_8_);
  local_59 = false;
  if (bVar1) {
    local_59 = ParseIntSafe<unsigned_short>(out,(string *)local_40);
  }
  std::__cxx11::string::~string((string *)local_40);
  return local_59;
}

Assistant:

bool FileTestReadInt(FileTest *file_test, T *out, const std::string &key) {
  std::string s;
  return file_test->GetAttribute(&s, key) && ParseIntSafe(out, s);
}